

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

QSize __thiscall QToolButton::sizeHint(QToolButton *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Representation RVar4;
  undefined8 uVar5;
  QStyle *pQVar6;
  QSize QVar7;
  Representation RVar8;
  Representation RVar9;
  Representation RVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_f0;
  QFontMetrics fm;
  QStyleOptionToolButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  if ((-1 < *(int *)(lVar2 + 0x2ac)) && (-1 < *(int *)(lVar2 + 0x2b0))) {
    QVar7 = *(QSize *)(lVar2 + 0x2ac);
    goto LAB_00477af8;
  }
  QWidget::ensurePolished((QWidget *)this);
  memset(&opt,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&opt);
  (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))(this,&opt);
  _fm = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::fontMetrics((QWidget *)&fm);
  RVar9.m_i = 0;
  QVar7.wd.m_i = 0;
  QVar7.ht.m_i = 0;
  if (opt.toolButtonStyle == ToolButtonTextOnly) {
LAB_004779df:
    QAbstractButton::text((QString *)&local_f0,&this->super_QAbstractButton);
    uVar5 = QFontMetrics::size((int)&fm,(QString *)0x800,(int)&local_f0,(int *)0x0);
    RVar8.m_i = (int)((ulong)uVar5 >> 0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
    iVar3 = QFontMetrics::horizontalAdvance((QChar)(char16_t)&fm);
    iVar3 = (int)uVar5 + iVar3 * 2;
    RVar10 = QVar7.wd.m_i;
    if (opt.toolButtonStyle == ToolButtonTextBesideIcon) {
      RVar4.m_i = iVar3 + RVar10.m_i + 4;
      if (RVar8.m_i < RVar9.m_i) {
        RVar8.m_i = RVar9.m_i;
      }
    }
    else {
      RVar4.m_i = iVar3;
      if ((opt.toolButtonStyle == ToolButtonTextUnderIcon) &&
         (RVar8.m_i = RVar8.m_i + RVar9.m_i + 4, RVar4.m_i = RVar10.m_i, RVar10.m_i < iVar3)) {
        RVar4.m_i = iVar3;
      }
    }
  }
  else {
    RVar9 = opt.iconSize.ht.m_i;
    QVar7 = opt.iconSize;
    RVar8.m_i = RVar9.m_i;
    RVar4.m_i = opt.iconSize.wd.m_i.m_i;
    if (opt.toolButtonStyle != ToolButtonIconOnly) goto LAB_004779df;
  }
  opt.super_QStyleOptionComplex.super_QStyleOption.rect.x2.m_i =
       opt.super_QStyleOptionComplex.super_QStyleOption.rect.x1.m_i + RVar4.m_i + -1;
  opt.super_QStyleOptionComplex.super_QStyleOption.rect.y2.m_i =
       opt.super_QStyleOptionComplex.super_QStyleOption.rect.y1.m_i + RVar8.m_i + -1;
  if (*(int *)(lVar2 + 0x2e8) == 1) {
    pQVar6 = QWidget::style((QWidget *)this);
    iVar3 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,2,&opt,this);
    RVar4.m_i = iVar3 + RVar4.m_i;
  }
  pQVar6 = QWidget::style((QWidget *)this);
  local_f0.d._0_4_ = RVar4.m_i;
  local_f0.d._4_4_ = RVar8.m_i;
  QVar7 = (QSize)(**(code **)(*(long *)pQVar6 + 0xe8))(pQVar6,3,&opt,&local_f0,this);
  *(QSize *)(lVar2 + 0x2ac) = QVar7;
  QFontMetrics::~QFontMetrics(&fm);
  QStyleOptionToolButton::~QStyleOptionToolButton(&opt);
LAB_00477af8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar7;
}

Assistant:

QSize QToolButton::sizeHint() const
{
    Q_D(const QToolButton);
    if (d->sizeHint.isValid())
        return d->sizeHint;
    ensurePolished();

    int w = 0, h = 0;
    QStyleOptionToolButton opt;
    initStyleOption(&opt);

    QFontMetrics fm = fontMetrics();
    if (opt.toolButtonStyle != Qt::ToolButtonTextOnly) {
        QSize icon = opt.iconSize;
        w = icon.width();
        h = icon.height();
    }

    if (opt.toolButtonStyle != Qt::ToolButtonIconOnly) {
        QSize textSize = fm.size(Qt::TextShowMnemonic, text());
        textSize.setWidth(textSize.width() + fm.horizontalAdvance(u' ') * 2);
        if (opt.toolButtonStyle == Qt::ToolButtonTextUnderIcon) {
            h += 4 + textSize.height();
            if (textSize.width() > w)
                w = textSize.width();
        } else if (opt.toolButtonStyle == Qt::ToolButtonTextBesideIcon) {
            w += 4 + textSize.width();
            if (textSize.height() > h)
                h = textSize.height();
        } else { // TextOnly
            w = textSize.width();
            h = textSize.height();
        }
    }

    opt.rect.setSize(QSize(w, h)); // PM_MenuButtonIndicator depends on the height
    if (d->popupMode == MenuButtonPopup)
        w += style()->pixelMetric(QStyle::PM_MenuButtonIndicator, &opt, this);

    d->sizeHint = style()->sizeFromContents(QStyle::CT_ToolButton, &opt, QSize(w, h), this);
    return d->sizeHint;
}